

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O0

void TIFFSwabArrayOfFloat(float *fp,tmsize_t n)

{
  undefined1 uVar1;
  uchar t;
  uchar *cp;
  tmsize_t n_local;
  float *fp_local;
  
  cp = (uchar *)n;
  n_local = (tmsize_t)fp;
  while (0 < (long)cp) {
    uVar1 = *(undefined1 *)(n_local + 3);
    *(undefined1 *)(n_local + 3) = *(undefined1 *)n_local;
    *(undefined1 *)n_local = uVar1;
    uVar1 = *(undefined1 *)(n_local + 2);
    *(undefined1 *)(n_local + 2) = *(undefined1 *)(n_local + 1);
    *(undefined1 *)(n_local + 1) = uVar1;
    n_local = n_local + 4;
    cp = cp + -1;
  }
  return;
}

Assistant:

void TIFFSwabArrayOfFloat(register float *fp, tmsize_t n)
{
    register unsigned char *cp;
    register unsigned char t;
    assert(sizeof(float) == 4);
    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)fp;
        t = cp[3];
        cp[3] = cp[0];
        cp[0] = t;
        t = cp[2];
        cp[2] = cp[1];
        cp[1] = t;
        fp++;
    }
}